

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

void __thiscall
icu_63::NFSubstitution::doSubstitution
          (NFSubstitution *this,int64_t number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  NFRuleSet *this_00;
  DecimalFormat *pDVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double x;
  double value;
  UnicodeString temp;
  UnicodeString local_e0;
  Formattable local_a0;
  
  this_00 = this->ruleSet;
  if (this_00 == (NFRuleSet *)0x0) {
    if (this->numberFormat != (DecimalFormat *)0x0) {
      if (number < 0x20000000000000) {
        (*(this->super_UObject)._vptr_UObject[9])((double)number,this);
        iVar3 = NumberFormat::getMaximumFractionDigits(&this->numberFormat->super_NumberFormat);
        value = x;
        if (iVar3 == 0) {
          value = uprv_floor_63(x);
        }
        local_e0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00401be0;
        local_e0.fUnion.fStackFields.fLengthAndFlags = 2;
        pDVar1 = this->numberFormat;
        Formattable::Formattable(&local_a0,value);
        Format::format((Format *)pDVar1,&local_a0,&local_e0,status);
        Formattable::~Formattable(&local_a0);
        if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
          local_e0.fUnion.fFields.fLength = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace
                  (toInsertInto,_pos + this->pos,0,&local_e0,0,local_e0.fUnion.fFields.fLength);
      }
      else {
        iVar2 = (*(this->super_UObject)._vptr_UObject[8])(this);
        local_e0.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00401be0;
        local_e0.fUnion.fStackFields.fLengthAndFlags = 2;
        pDVar1 = this->numberFormat;
        Formattable::Formattable(&local_a0,CONCAT44(extraout_var_00,iVar2));
        Format::format((Format *)pDVar1,&local_a0,&local_e0,status);
        Formattable::~Formattable(&local_a0);
        if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
          local_e0.fUnion.fFields.fLength = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        UnicodeString::doReplace
                  (toInsertInto,_pos + this->pos,0,&local_e0,0,local_e0.fUnion.fFields.fLength);
      }
      UnicodeString::~UnicodeString(&local_e0);
    }
    return;
  }
  iVar2 = (*(this->super_UObject)._vptr_UObject[8])(this);
  NFRuleSet::format(this_00,CONCAT44(extraout_var,iVar2),toInsertInto,_pos + this->pos,
                    recursionCount,status);
  return;
}

Assistant:

void
NFSubstitution::doSubstitution(int64_t number, UnicodeString& toInsertInto, int32_t _pos, int32_t recursionCount, UErrorCode& status) const
{
    if (ruleSet != NULL) {
        // Perform a transformation on the number that is dependent
        // on the type of substitution this is, then just call its
        // rule set's format() method to format the result
        ruleSet->format(transformNumber(number), toInsertInto, _pos + this->pos, recursionCount, status);
    } else if (numberFormat != NULL) {
        if (number <= MAX_INT64_IN_DOUBLE) {
            // or perform the transformation on the number (preserving
            // the result's fractional part if the formatter it set
            // to show it), then use that formatter's format() method
            // to format the result
            double numberToFormat = transformNumber((double)number);
            if (numberFormat->getMaximumFractionDigits() == 0) {
                numberToFormat = uprv_floor(numberToFormat);
            }

            UnicodeString temp;
            numberFormat->format(numberToFormat, temp, status);
            toInsertInto.insert(_pos + this->pos, temp);
        } 
        else { 
            // We have gone beyond double precision. Something has to give. 
            // We're favoring accuracy of the large number over potential rules 
            // that round like a CompactDecimalFormat, which is not a common use case. 
            // 
            // Perform a transformation on the number that is dependent 
            // on the type of substitution this is, then just call its 
            // rule set's format() method to format the result 
            int64_t numberToFormat = transformNumber(number); 
            UnicodeString temp;
            numberFormat->format(numberToFormat, temp, status);
            toInsertInto.insert(_pos + this->pos, temp);
        } 
    }
}